

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void av1_set_speed_features_framesize_dependent(AV1_COMP *cpi,int speed)

{
  MODE MVar1;
  SequenceHeader *pSVar2;
  int in_ESI;
  AV1_COMP *in_RDI;
  AV1EncoderConfig *oxcf;
  SPEED_FEATURES *sf;
  SPEED_FEATURES *in_stack_00000028;
  undefined4 in_stack_00000030;
  int in_stack_00000034;
  SPEED_FEATURES *in_stack_00000038;
  AV1_COMP *in_stack_00000040;
  
  MVar1 = (in_RDI->oxcf).mode;
  if (MVar1 == '\0') {
    set_good_speed_feature_framesize_dependent
              (in_stack_00000040,in_stack_00000038,in_stack_00000034);
  }
  else if (MVar1 == '\x01') {
    set_rt_speed_feature_framesize_dependent
              ((AV1_COMP *)CONCAT44(in_stack_00000034,in_stack_00000030),in_stack_00000028,cpi._4_4_
              );
  }
  else if (MVar1 == '\x02') {
    set_allintra_speed_feature_framesize_dependent(in_RDI,&in_RDI->sf,in_ESI);
  }
  if (in_RDI->ppi->seq_params_locked == 0) {
    pSVar2 = (in_RDI->common).seq_params;
    pSVar2->enable_masked_compound =
         pSVar2->enable_masked_compound &
         ((in_RDI->sf).inter_sf.disable_masked_comp != 0 ^ 0xffU) & 1;
    pSVar2 = (in_RDI->common).seq_params;
    pSVar2->enable_interintra_compound =
         pSVar2->enable_interintra_compound &
         (in_RDI->sf).inter_sf.disable_interintra_wedge_var_thresh != 0xffffffff;
  }
  set_subpel_search_method
            (&in_RDI->mv_search_params,(in_RDI->oxcf).unit_test_cfg.motion_vector_unit_test,
             (in_RDI->sf).mv_sf.subpel_search_method);
  if (((((in_RDI->oxcf).row_mt & 1U) == 1) && (1 < (in_RDI->mt_info).num_workers)) &&
     ((in_RDI->sf).inter_sf.mv_cost_upd_level == INTERNAL_COST_UPD_SBROW_SET)) {
    (in_RDI->sf).inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
  }
  return;
}

Assistant:

void av1_set_speed_features_framesize_dependent(AV1_COMP *cpi, int speed) {
  SPEED_FEATURES *const sf = &cpi->sf;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  switch (oxcf->mode) {
    case GOOD:
      set_good_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
    case ALLINTRA:
      set_allintra_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
    case REALTIME:
      set_rt_speed_feature_framesize_dependent(cpi, sf, speed);
      break;
  }

  if (!cpi->ppi->seq_params_locked) {
    cpi->common.seq_params->enable_masked_compound &=
        !sf->inter_sf.disable_masked_comp;
    cpi->common.seq_params->enable_interintra_compound &=
        (sf->inter_sf.disable_interintra_wedge_var_thresh != UINT_MAX);
  }

  set_subpel_search_method(&cpi->mv_search_params,
                           cpi->oxcf.unit_test_cfg.motion_vector_unit_test,
                           sf->mv_sf.subpel_search_method);

  // For multi-thread use case with row_mt enabled, cost update for a set of
  // SB rows is not desirable. Hence, the sf mv_cost_upd_level is set to
  // INTERNAL_COST_UPD_SBROW in such cases.
  if ((cpi->oxcf.row_mt == 1) && (cpi->mt_info.num_workers > 1)) {
    if (sf->inter_sf.mv_cost_upd_level == INTERNAL_COST_UPD_SBROW_SET) {
      // Set mv_cost_upd_level to use row level update.
      sf->inter_sf.mv_cost_upd_level = INTERNAL_COST_UPD_SBROW;
    }
  }
}